

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core-as.c
# Opt level: O3

ull getbf_as(bitfield *bf,ull *a,ull *m)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  ulong uVar4;
  byte bVar5;
  byte bVar6;
  int iVar7;
  ulong uVar8;
  int iVar9;
  bool bVar10;
  ulong uVar11;
  long lVar12;
  
  iVar9 = bf->shr;
  lVar12 = 0;
  uVar4 = 0;
  bVar3 = true;
  do {
    bVar10 = bVar3;
    iVar1 = bf->sbf[lVar12].pos;
    iVar7 = iVar1 + 0x3f;
    if (-1 < iVar1) {
      iVar7 = iVar1;
    }
    iVar2 = bf->sbf[lVar12].len;
    uVar11 = ~(-1L << ((byte)iVar2 & 0x3f));
    bVar5 = (byte)(iVar1 % 0x40);
    uVar8 = uVar11 << (bVar5 & 0x3f);
    lVar12 = (long)(iVar7 >> 6);
    m[lVar12] = m[lVar12] | uVar8;
    uVar8 = (uVar8 & a[lVar12]) >> (bVar5 & 0x3f);
    if (0x40 < iVar1 % 0x40 + iVar2) {
      uVar11 = uVar11 >> (-bVar5 & 0x3f);
      m[lVar12 + 1] = m[lVar12 + 1] | uVar11;
      uVar8 = uVar8 | (uVar11 & a[lVar12 + 1]) << (-bVar5 & 0x3f);
    }
    uVar4 = uVar4 | uVar8 << ((byte)iVar9 & 0x3f);
    iVar9 = iVar9 + iVar2;
    lVar12 = 1;
    bVar3 = false;
  } while (bVar10);
  bVar5 = (byte)iVar9;
  switch(bf->mode) {
  case BF_SIGNED:
    bVar6 = bVar5 - 1;
    break;
  case BF_SLIGHTLY_SIGNED:
    if ((uVar4 >> ((ulong)(byte)(bVar5 - 1) & 0x3f) & 1) == 0) goto switchD_00245711_default;
    bVar6 = bVar5 - 2;
    break;
  case BF_ULTRASIGNED:
    goto switchD_00245711_caseD_3;
  case BF_LUT:
    uVar4 = bf->lut[uVar4];
  default:
    goto switchD_00245711_default;
  }
  if ((uVar4 >> ((ulong)bVar6 & 0x3f) & 1) != 0) {
switchD_00245711_caseD_3:
    uVar4 = uVar4 + (-1L << (bVar5 & 0x3f));
  }
switchD_00245711_default:
  return (uVar4 ^ bf->xorend) + bf->addend;
}

Assistant:

ull getbf_as(const struct bitfield *bf, ull *a, ull *m) {
	ull res = 0;
	int pos = bf->shr;
	int i;
	for (i = 0; i < sizeof(bf->sbf) / sizeof(bf->sbf[0]); i++) {
		res |= BF(bf->sbf[i].pos, bf->sbf[i].len) << pos;
		pos += bf->sbf[i].len;
	}
	switch (bf->mode) {
		case BF_UNSIGNED:
			break;
		case BF_SIGNED:
			if (res & 1ull << (pos - 1))
				res -= 1ull << pos;
			break;
		case BF_SLIGHTLY_SIGNED:
			if (res & 1ull << (pos - 1) && res & 1ull << (pos - 2))
				res -= 1ull << pos;
			break;
		case BF_ULTRASIGNED:
			res -= 1ull << pos;
			break;
		case BF_LUT:
			res = bf->lut[res];
			break;
	}
	res ^= bf->xorend;
	res += bf->addend;
	return res;
}